

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O1

void ZopfliStoreLitLenDist
               (unsigned_short length,unsigned_short dist,size_t pos,ZopfliLZ77Store *store)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  size_t *psVar5;
  size_t sVar6;
  unsigned_short *puVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  uint uVar11;
  long lVar12;
  
  uVar2 = store->size;
  uVar9 = uVar2 / 9 & 0xffffffffffffffe0;
  if (uVar2 == uVar9 * 9) {
    sVar10 = uVar2 << 4;
    lVar12 = 0;
    do {
      if ((uVar2 + lVar12 & (uVar2 + lVar12) - 1) == 0) {
        if (uVar2 + lVar12 == 0) {
          psVar5 = (size_t *)malloc(8);
        }
        else {
          psVar5 = (size_t *)realloc(store->ll_counts,sVar10);
        }
        store->ll_counts = psVar5;
      }
      if (uVar2 == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = store->ll_counts[uVar2 + lVar12 + -0x120];
      }
      store->ll_counts[uVar2 + lVar12] = sVar6;
      lVar12 = lVar12 + 1;
      sVar10 = sVar10 + 0x10;
    } while (lVar12 != 0x120);
  }
  if ((uVar2 & 0x1f) == 0) {
    sVar10 = uVar2 << 4;
    lVar12 = 0;
    do {
      if ((uVar2 + lVar12 & (uVar2 + lVar12) - 1) == 0) {
        if (uVar2 + lVar12 == 0) {
          psVar5 = (size_t *)malloc(8);
        }
        else {
          psVar5 = (size_t *)realloc(store->d_counts,sVar10);
        }
        store->d_counts = psVar5;
      }
      if (uVar2 == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = store->d_counts[uVar2 + lVar12 + -0x20];
      }
      store->d_counts[uVar2 + lVar12] = sVar6;
      lVar12 = lVar12 + 1;
      sVar10 = sVar10 + 0x10;
    } while (lVar12 != 0x20);
  }
  uVar8 = store->size;
  if ((uVar8 & uVar8 - 1) == 0) {
    if (uVar8 == 0) {
      puVar7 = (unsigned_short *)malloc(2);
    }
    else {
      puVar7 = (unsigned_short *)realloc(store->litlens,uVar8 << 2);
    }
    store->litlens = puVar7;
  }
  store->litlens[store->size] = length;
  store->size = uVar2;
  uVar8 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
  uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
  uVar8 = ((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar8 >> 0x38 < 2) {
    if (uVar2 == 0) {
      puVar7 = (unsigned_short *)malloc(2);
    }
    else {
      puVar7 = (unsigned_short *)realloc(store->dists,uVar2 * 4);
    }
    store->dists = puVar7;
    puVar7[store->size] = dist;
    store->size = uVar2;
    if (uVar2 == 0) {
      psVar5 = (size_t *)malloc(8);
    }
    else {
      psVar5 = (size_t *)realloc(store->pos,uVar2 << 4);
    }
    store->pos = psVar5;
  }
  else {
    store->dists[uVar2] = dist;
    store->size = uVar2;
  }
  store->pos[store->size] = pos;
  store->size = uVar2;
  bVar3 = (byte)(uVar8 >> 0x38);
  if (dist == 0) {
    if (bVar3 < 2) {
      if (uVar2 == 0) {
        puVar7 = (unsigned_short *)malloc(2);
      }
      else {
        puVar7 = (unsigned_short *)realloc(store->ll_symbol,uVar2 * 4);
      }
      store->ll_symbol = puVar7;
      puVar7[store->size] = length;
      store->size = uVar2;
      if (uVar2 == 0) {
        puVar7 = (unsigned_short *)malloc(2);
      }
      else {
        puVar7 = (unsigned_short *)realloc(store->d_symbol,uVar2 << 2);
      }
      store->d_symbol = puVar7;
    }
    else {
      store->ll_symbol[uVar2] = length;
      store->size = uVar2;
    }
    sVar6 = store->size;
    store->d_symbol[sVar6] = 0;
    store->size = sVar6 + 1;
    psVar5 = store->ll_counts + uVar9 * 9 + (ulong)(uint)length;
  }
  else {
    if (bVar3 < 2) {
      if (uVar2 == 0) {
        puVar7 = (unsigned_short *)malloc(2);
      }
      else {
        puVar7 = (unsigned_short *)realloc(store->ll_symbol,uVar2 * 4);
      }
      store->ll_symbol = puVar7;
    }
    iVar1 = *(int *)(ZopfliGetLengthSymbol_table + (ulong)(uint)length * 4);
    store->ll_symbol[store->size] = (unsigned_short)iVar1;
    store->size = uVar2;
    if (bVar3 < 2) {
      if (uVar2 == 0) {
        puVar7 = (unsigned_short *)malloc(2);
      }
      else {
        puVar7 = (unsigned_short *)realloc(store->d_symbol,uVar2 * 4);
      }
      store->d_symbol = puVar7;
    }
    uVar11 = dist - 1;
    uVar4 = uVar11;
    if (4 < dist) {
      uVar4 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = (uint)((uVar11 >> ((byte)(0x1e - (char)(uVar4 ^ 0x1f)) & 0x1f) & 1) != 0) +
              (uVar4 ^ 0x1f) * 2 ^ 0x3e;
    }
    sVar6 = store->size;
    store->d_symbol[sVar6] = (unsigned_short)uVar4;
    store->size = sVar6 + 1;
    store->ll_counts[uVar9 * 9 + (long)iVar1] = store->ll_counts[uVar9 * 9 + (long)iVar1] + 1;
    if (4 < dist) {
      uVar4 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar11 = (uint)((uVar11 >> ((byte)(0x1e - (char)(uVar4 ^ 0x1f)) & 0x1f) & 1) != 0) +
               (uVar4 ^ 0x1f) * 2 ^ 0x3e;
    }
    psVar5 = store->d_counts + (uVar2 & 0xffffffffffffffe0 | (ulong)uVar11);
  }
  *psVar5 = *psVar5 + 1;
  return;
}

Assistant:

void ZopfliStoreLitLenDist(unsigned short length, unsigned short dist,
                           size_t pos, ZopfliLZ77Store* store) {
  size_t i;
  /* Needed for using ZOPFLI_APPEND_DATA multiple times. */
  size_t origsize = store->size;
  size_t llstart = ZOPFLI_NUM_LL * (origsize / ZOPFLI_NUM_LL);
  size_t dstart = ZOPFLI_NUM_D * (origsize / ZOPFLI_NUM_D);

  /* Everytime the index wraps around, a new cumulative histogram is made: we're
  keeping one histogram value per LZ77 symbol rather than a full histogram for
  each to save memory. */
  if (origsize % ZOPFLI_NUM_LL == 0) {
    size_t llsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_LL; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->ll_counts[origsize - ZOPFLI_NUM_LL + i],
          &store->ll_counts, &llsize);
    }
  }
  if (origsize % ZOPFLI_NUM_D == 0) {
    size_t dsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_D; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->d_counts[origsize - ZOPFLI_NUM_D + i],
          &store->d_counts, &dsize);
    }
  }

  ZOPFLI_APPEND_DATA(length, &store->litlens, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(dist, &store->dists, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(pos, &store->pos, &store->size);
  assert(length < 259);

  if (dist == 0) {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(length, &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(0, &store->d_symbol, &store->size);
    store->ll_counts[llstart + length]++;
  } else {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetLengthSymbol(length),
                       &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetDistSymbol(dist),
                       &store->d_symbol, &store->size);
    store->ll_counts[llstart + ZopfliGetLengthSymbol(length)]++;
    store->d_counts[dstart + ZopfliGetDistSymbol(dist)]++;
  }
}